

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O1

void osd_msg(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  retro_message screen_msg;
  va_list va;
  char msg [201];
  char *local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  uint *local_1b0;
  undefined1 *local_1a8;
  undefined1 local_198 [8];
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  char local_e8 [208];
  
  if (in_AL != '\0') {
    local_168 = in_XMM0_Da;
    local_158 = in_XMM1_Qa;
    local_148 = in_XMM2_Qa;
    local_138 = in_XMM3_Qa;
    local_128 = in_XMM4_Qa;
    local_118 = in_XMM5_Qa;
    local_108 = in_XMM6_Qa;
    local_f8 = in_XMM7_Qa;
  }
  local_190 = in_RSI;
  local_188 = in_RDX;
  local_180 = in_RCX;
  local_178 = in_R8;
  local_170 = in_R9;
  memset(local_e8,0,0xc9);
  local_1b0 = &screen_msg.frames;
  local_1b8 = 0x3000000008;
  local_1a8 = local_198;
  vsnprintf(local_e8,200,fmt,&local_1b8);
  uStack_1c0 = 0x168;
  local_1c8 = local_e8;
  (*env_cb)(6,&local_1c8);
  return;
}

Assistant:

static void osd_msg(const char *fmt, ...)
{
   char msg[MAX_OSD_MSG_LEN + 1] = {0};

   va_list va;
   va_start(va, fmt);
   vsnprintf(msg, MAX_OSD_MSG_LEN, fmt, va);
   va_end(va);

   struct retro_message screen_msg = {0};
   screen_msg.msg = msg;
   screen_msg.frames = OSD_MSG_DURATION;

   env_cb(RETRO_ENVIRONMENT_SET_MESSAGE, &screen_msg);
}